

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Copter.h
# Opt level: O0

void __thiscall
chrono::copter::Copter<6>::AddVisualizationAssets
          (Copter<6> *this,string *chassismesh,string *propellermesh,ChFrame<double> *cor_m1,
          ChFrame<double> *cor_m2)

{
  bool bVar1;
  element_type *peVar2;
  ChColor *pCVar3;
  element_type *peVar4;
  reference psVar5;
  shared_ptr<chrono::ChVisualShape> local_108;
  ChColor local_f4;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> local_e8;
  undefined1 local_d8 [8];
  shared_ptr<chrono::ChTriangleMeshShape> trimesh_prop_shape;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> prop_trimesh;
  shared_ptr<chrono::ChBody> propeller;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
  *__range2;
  ChColor local_7c;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> local_70 [2];
  undefined1 local_50 [8];
  shared_ptr<chrono::ChTriangleMeshShape> trimesh_shape;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> trimesh;
  ChFrame<double> *cor_m2_local;
  ChFrame<double> *cor_m1_local;
  string *propellermesh_local;
  string *chassismesh_local;
  Copter<6> *this_local;
  
  chrono::geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((string *)
             &trimesh_shape.
              super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,SUB81(chassismesh,0),true);
  chrono_types::make_shared<chrono::ChTriangleMeshShape,_0>();
  peVar2 = std::
           __shared_ptr_access<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
  std::shared_ptr<chrono::geometry::ChTriangleMeshConnected>::shared_ptr
            (local_70,(shared_ptr<chrono::geometry::ChTriangleMeshConnected> *)
                      &trimesh_shape.
                       super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  chrono::ChTriangleMeshShape::SetMesh(peVar2,local_70,1);
  std::shared_ptr<chrono::geometry::ChTriangleMeshConnected>::~shared_ptr(local_70);
  peVar2 = std::
           __shared_ptr_access<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
  ChVisualShape::SetMutable((ChVisualShape *)peVar2,false);
  pCVar3 = (ChColor *)
           std::
           __shared_ptr_access<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
  ChColor::ChColor(&local_7c,0.2,0.32,0.48);
  chrono::ChVisualShape::SetColor(pCVar3);
  peVar4 = std::__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->chassis);
  std::shared_ptr<chrono::ChVisualShape>::shared_ptr<chrono::ChTriangleMeshShape,void>
            ((shared_ptr<chrono::ChVisualShape> *)&__range2,
             (shared_ptr<chrono::ChTriangleMeshShape> *)local_50);
  chrono::ChPhysicsItem::AddVisualShape
            (peVar4,(shared_ptr<chrono::ChVisualShape> *)&__range2,cor_m1);
  std::shared_ptr<chrono::ChVisualShape>::~shared_ptr
            ((shared_ptr<chrono::ChVisualShape> *)&__range2);
  __end2 = std::
           vector<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
           ::begin(&this->props);
  propeller.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       vector<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>::
       end(&this->props);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::shared_ptr<chrono::ChBody>_*,_std::vector<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>_>
                                *)&propeller.
                                   super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
    if (!bVar1) break;
    psVar5 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<chrono::ChBody>_*,_std::vector<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>_>
             ::operator*(&__end2);
    std::shared_ptr<chrono::ChBody>::shared_ptr
              ((shared_ptr<chrono::ChBody> *)
               &prop_trimesh.
                super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,psVar5);
    chrono::geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
              ((string *)
               &trimesh_prop_shape.
                super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,SUB81(propellermesh,0),true);
    chrono_types::make_shared<chrono::ChTriangleMeshShape,_0>();
    peVar2 = std::
             __shared_ptr_access<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_d8);
    std::shared_ptr<chrono::geometry::ChTriangleMeshConnected>::shared_ptr
              (&local_e8,
               (shared_ptr<chrono::geometry::ChTriangleMeshConnected> *)
               &trimesh_prop_shape.
                super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    chrono::ChTriangleMeshShape::SetMesh(peVar2,&local_e8,1);
    std::shared_ptr<chrono::geometry::ChTriangleMeshConnected>::~shared_ptr(&local_e8);
    peVar2 = std::
             __shared_ptr_access<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_d8);
    ChVisualShape::SetMutable((ChVisualShape *)peVar2,false);
    pCVar3 = (ChColor *)
             std::
             __shared_ptr_access<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_d8);
    ChColor::ChColor(&local_f4,0.8,0.68,0.52);
    chrono::ChVisualShape::SetColor(pCVar3);
    peVar4 = std::__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&prop_trimesh.
                            super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
    std::shared_ptr<chrono::ChVisualShape>::shared_ptr<chrono::ChTriangleMeshShape,void>
              (&local_108,(shared_ptr<chrono::ChTriangleMeshShape> *)local_d8);
    chrono::ChPhysicsItem::AddVisualShape(peVar4,&local_108,cor_m2);
    std::shared_ptr<chrono::ChVisualShape>::~shared_ptr(&local_108);
    std::shared_ptr<chrono::ChTriangleMeshShape>::~shared_ptr
              ((shared_ptr<chrono::ChTriangleMeshShape> *)local_d8);
    std::shared_ptr<chrono::geometry::ChTriangleMeshConnected>::~shared_ptr
              ((shared_ptr<chrono::geometry::ChTriangleMeshConnected> *)
               &trimesh_prop_shape.
                super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<chrono::ChBody>::~shared_ptr
              ((shared_ptr<chrono::ChBody> *)
               &prop_trimesh.
                super___shared_ptr<chrono::geometry::ChTriangleMeshConnected,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<chrono::ChBody>_*,_std::vector<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>_>
    ::operator++(&__end2);
  }
  std::shared_ptr<chrono::ChTriangleMeshShape>::~shared_ptr
            ((shared_ptr<chrono::ChTriangleMeshShape> *)local_50);
  std::shared_ptr<chrono::geometry::ChTriangleMeshConnected>::~shared_ptr
            ((shared_ptr<chrono::geometry::ChTriangleMeshConnected> *)
             &trimesh_shape.
              super___shared_ptr<chrono::ChTriangleMeshShape,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void Copter<nop>::AddVisualizationAssets(const std::string& chassismesh,
                                         const std::string& propellermesh,
                                         const ChFrame<>& cor_m1,
                                         const ChFrame<>& cor_m2) {
    auto trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(chassismesh, true, true);
    auto trimesh_shape = chrono_types::make_shared<ChTriangleMeshShape>();
    trimesh_shape->SetMesh(trimesh);
    trimesh_shape->SetMutable(false);
    trimesh_shape->SetColor(ChColor(0.2f, 0.32f, 0.48f));
    chassis->AddVisualShape(trimesh_shape, cor_m1);

    for (auto propeller : props) {
        auto prop_trimesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(propellermesh, true, true);
        auto trimesh_prop_shape = chrono_types::make_shared<ChTriangleMeshShape>();
        trimesh_prop_shape->SetMesh(prop_trimesh);
        trimesh_prop_shape->SetMutable(false);
        trimesh_prop_shape->SetColor(ChColor(0.8f, 0.68f, 0.52f));
        propeller->AddVisualShape(trimesh_prop_shape, cor_m2);
    }
}